

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O0

int xc_func_find_ext_params_name(xc_func_type *p,char *name)

{
  int iVar1;
  char *in_RSI;
  long *in_RDI;
  int ii;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (*(int *)(*in_RDI + 0x50) <= local_1c) {
      return -1;
    }
    iVar1 = strcmp(*(char **)(*(long *)(*in_RDI + 0x58) + (long)local_1c * 8),in_RSI);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

static int
xc_func_find_ext_params_name(const xc_func_type *p, const char *name) {
  int ii;
  assert(p != NULL && p->info->ext_params.n > 0);
  for(ii=0; ii<p->info->ext_params.n; ii++){
    if(strcmp(p->info->ext_params.names[ii], name) == 0) {
      return ii;
    }
  }
  return -1;
}